

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O0

void __thiscall crnlib::dds_comp::~dds_comp(dds_comp *this)

{
  dds_comp *this_local;
  
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__dds_comp_00269950;
  crnlib_delete<crnlib::mipmapped_texture::qdxt_state>(this->m_pQDXT_state);
  task_pool::~task_pool(&this->m_task_pool);
  vector<unsigned_char>::~vector(&this->m_comp_data);
  mipmapped_texture::~mipmapped_texture(&this->m_packed_tex);
  mipmapped_texture::~mipmapped_texture(&this->m_src_tex);
  itexture_comp::~itexture_comp(&this->super_itexture_comp);
  return;
}

Assistant:

dds_comp::~dds_comp()
    {
        crnlib_delete(m_pQDXT_state);
    }